

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  Vdbe *p;
  Expr *pExpr;
  uint op;
  int p1;
  Op *pOVar1;
  int iVar2;
  int target_00;
  int iVar3;
  int iVar4;
  byte bVar5;
  anon_union_4_2_6146edf4_for_u *paVar6;
  long in_FS_OFFSET;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = pList->nExpr;
  if (0 < iVar4) {
    p = pParse->pVdbe;
    bVar5 = flags & 0xfd;
    if (pParse->okConstFactor != '\0') {
      bVar5 = flags;
    }
    op = (uint)(flags & 1 ^ 0x51);
    paVar6 = &pList->a[0].u;
    iVar3 = 0;
    do {
      pExpr = ((ExprList_item *)(paVar6 + -5))->pExpr;
      if (((bVar5 & 4) == 0) || ((paVar6->x).iOrderByCol == 0)) {
        if ((bVar5 & 2) == 0) {
LAB_00179c65:
          target_00 = target + iVar3;
          p1 = sqlite3ExprCodeTarget(pParse,pExpr,target_00);
          if (p1 != target_00) {
            if ((flags & 1) != 0) {
              pOVar1 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (p->db->mallocFailed == '\0') {
                pOVar1 = p->aOp + (long)p->nOp + -1;
              }
              if ((((pOVar1->opcode == 'P') && (iVar2 = pOVar1->p3 + 1, pOVar1->p1 + iVar2 == p1))
                  && (pOVar1->p2 + iVar2 == target_00)) && (pOVar1->p5 == 0)) {
                pOVar1->p3 = iVar2;
                goto LAB_00179d81;
              }
            }
            sqlite3VdbeAddOp3(p,op,p1,target_00,0);
          }
        }
        else {
          local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.walkerDepth = -0x55555556;
          local_68.eCode = 2;
          local_68.mWFlags = 0xaaaa;
          local_68.xExprCallback = exprNodeIsConstant;
          local_68.xSelectCallback = sqlite3SelectWalkFail;
          local_68.pParse = pParse;
          if (pExpr != (Expr *)0x0) {
            sqlite3WalkExprNN(&local_68,pExpr);
            if (local_68.eCode == 0) goto LAB_00179c65;
          }
          sqlite3ExprCodeRunJustOnce(pParse,pExpr,iVar3 + target);
        }
      }
      else if ((bVar5 & 8) == 0) {
        sqlite3VdbeAddOp3(p,op,(uint)(paVar6->x).iOrderByCol + srcReg + -1,iVar3 + target,0);
      }
      else {
        iVar3 = iVar3 + -1;
        iVar4 = iVar4 + -1;
      }
LAB_00179d81:
      iVar3 = iVar3 + 1;
      paVar6 = paVar6 + 6;
    } while (iVar3 < iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( pItem->fg.bSorterRef ){
      i--;
      n--;
    }else
#endif
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0
           && sqlite3ExprIsConstantNotJoin(pParse,pExpr)
    ){
      sqlite3ExprCodeRunJustOnce(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetLastOp(v))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
         && pOp->p5==0  /* The do-not-merge flag must be clear */
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}